

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O0

int CfdCreateConfidentialAddress
              (void *handle,char *address,char *confidential_key,char **confidential_address)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 *in_RCX;
  ConfidentialKey *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ElementsConfidentialAddress confidential_addr;
  Pubkey key;
  Address addr;
  ElementsAddressFactory factory;
  ElementsConfidentialAddress *in_stack_fffffffffffff900;
  AddressFactory *in_stack_fffffffffffff908;
  string *in_stack_fffffffffffff910;
  undefined8 in_stack_fffffffffffff918;
  CfdError error_code;
  Address *unblinded_address;
  CfdException *in_stack_fffffffffffff920;
  ElementsAddressFactory *in_stack_fffffffffffff930;
  string *in_stack_fffffffffffff960;
  string local_680;
  ElementsConfidentialAddress local_660;
  ElementsConfidentialAddress local_4b0;
  undefined1 local_2f9 [519];
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  ConfidentialKey *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff918 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_28 == (undefined8 *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x49;
    local_50.funcname = "CfdCreateConfidentialAddress";
    cfd::core::logger::warn<>(&local_50,"confidential address is null.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,"Failed to parameter. confidential address is null.",&local_71);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff920,error_code,in_stack_fffffffffffff910);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString((char *)local_20);
    if (!bVar1) {
      cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_fffffffffffff930);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_2f9 + 0x41),local_18,(allocator *)((long)local_2f9 + 0x40));
      cfd::AddressFactory::GetAddress(in_stack_fffffffffffff908,(string *)in_stack_fffffffffffff900)
      ;
      std::__cxx11::string::~string((string *)(local_2f9 + 0x41));
      std::allocator<char>::~allocator((allocator<char> *)((long)local_2f9 + 0x40));
      unblinded_address = (Address *)local_2f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)((long)local_2f9 + 1),(char *)local_20,(allocator *)unblinded_address);
      cfd::core::Pubkey::Pubkey((Pubkey *)((long)local_2f9 + 0x21),(string *)((long)local_2f9 + 1));
      std::__cxx11::string::~string((string *)((long)local_2f9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2f9);
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_4b0);
      cfd::ElementsAddressFactory::GetConfidentialAddress(unblinded_address,local_20);
      cfd::core::ElementsConfidentialAddress::operator=(&local_4b0,&local_660);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                (in_stack_fffffffffffff900);
      cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_680,&local_4b0);
      pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffff960);
      *local_28 = pcVar3;
      std::__cxx11::string::~string((string *)&local_680);
      local_4 = 0;
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                (in_stack_fffffffffffff900);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x5a0b55);
      cfd::core::Address::~Address(&in_stack_fffffffffffff900->unblinded_address_);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x5a0b6f);
      return local_4;
    }
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x55;
    local_d0.funcname = "CfdCreateConfidentialAddress";
    cfd::core::logger::warn<>(&local_d0,"confidential key is null or empty.");
    local_f2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f0,"Failed to parameter. confidential key is null or empty.",&local_f1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff920,error_code,in_stack_fffffffffffff910);
    local_f2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0x4f;
  local_90.funcname = "CfdCreateConfidentialAddress";
  cfd::core::logger::warn<>(&local_90,"address is null or empty.");
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Failed to parameter. address is null or empty.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffff920,error_code,in_stack_fffffffffffff910);
  local_b2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateConfidentialAddress(
    void* handle, const char* address, const char* confidential_key,
    char** confidential_address) {
  try {
    cfd::Initialize();
    if (confidential_address == nullptr) {
      warn(CFD_LOG_SOURCE, "confidential address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential address is null.");
    }
    if (IsEmptyString(address)) {
      warn(CFD_LOG_SOURCE, "address is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null or empty.");
    }
    if (IsEmptyString(confidential_key)) {
      warn(CFD_LOG_SOURCE, "confidential key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential key is null or empty.");
    }

    ElementsAddressFactory factory;
    Address addr = factory.GetAddress(address);
    Pubkey key = Pubkey(confidential_key);

    ElementsConfidentialAddress confidential_addr;
    confidential_addr = factory.GetConfidentialAddress(addr, key);
    *confidential_address = CreateString(confidential_addr.GetAddress());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}